

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

TemplateString * __thiscall
ctemplate::TemplateDictionary::GetValue
          (TemplateString *__return_storage_ptr__,TemplateDictionary *this,TemplateString *variable)

{
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  undefined7 uVar2;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  *c;
  undefined8 *puVar3;
  TemplateId TVar4;
  second_type *psVar5;
  TemplateString *it_2;
  ReaderMutexLock ml;
  TemplateString *it_1;
  VariableDict *template_global_vars;
  TemplateString *it;
  TemplateDictionary *d;
  TemplateString *variable_local;
  TemplateDictionary *this_local;
  
  for (it = (TemplateString *)this; it != (TemplateString *)0x0; it = (TemplateString *)it[3].ptr_)
  {
    if (it[1].id_ != 0) {
      psVar1 = (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                *)it[1].id_;
      TVar4 = TemplateString::GetGlobalId(variable);
      psVar5 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar4);
      if (psVar5 != (second_type *)0x0) {
        __return_storage_ptr__->ptr_ = psVar5->ptr_;
        __return_storage_ptr__->length_ = psVar5->length_;
        uVar2 = *(undefined7 *)&psVar5->field_0x11;
        __return_storage_ptr__->is_immutable_ = psVar5->is_immutable_;
        *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar2;
        __return_storage_ptr__->id_ = psVar5->id_;
        return __return_storage_ptr__;
      }
    }
  }
  if (this->template_global_dict_owner_ != (TemplateDictionary *)0x0) {
    if ((this->template_global_dict_owner_->template_global_dict_ != (TemplateDictionary *)0x0) &&
       (this->template_global_dict_owner_->template_global_dict_->variable_dict_ !=
        (VariableDict *)0x0)) {
      psVar1 = this->template_global_dict_owner_->template_global_dict_->variable_dict_;
      TVar4 = TemplateString::GetGlobalId(variable);
      psVar5 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (psVar1,TVar4);
      if (psVar5 != (second_type *)0x0) {
        __return_storage_ptr__->ptr_ = psVar5->ptr_;
        __return_storage_ptr__->length_ = psVar5->length_;
        uVar2 = *(undefined7 *)&psVar5->field_0x11;
        __return_storage_ptr__->is_immutable_ = psVar5->is_immutable_;
        *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar2;
        __return_storage_ptr__->id_ = psVar5->id_;
        return __return_storage_ptr__;
      }
      ml.mu_ = (Mutex *)0x0;
    }
    ReaderMutexLock::ReaderMutexLock((ReaderMutexLock *)&it_2,(Mutex *)&g_static_mutex);
    c = global_dict_;
    TVar4 = TemplateString::GetGlobalId(variable);
    psVar5 = find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,unsigned_long>
                       (c,TVar4);
    puVar3 = empty_string_;
    if (psVar5 == (second_type *)0x0) {
      __return_storage_ptr__->ptr_ = (char *)*empty_string_;
      __return_storage_ptr__->length_ = puVar3[1];
      *(undefined8 *)&__return_storage_ptr__->is_immutable_ = puVar3[2];
      __return_storage_ptr__->id_ = puVar3[3];
    }
    else {
      __return_storage_ptr__->ptr_ = psVar5->ptr_;
      __return_storage_ptr__->length_ = psVar5->length_;
      uVar2 = *(undefined7 *)&psVar5->field_0x11;
      __return_storage_ptr__->is_immutable_ = psVar5->is_immutable_;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar2;
      __return_storage_ptr__->id_ = psVar5->id_;
    }
    ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&it_2);
    return __return_storage_ptr__;
  }
  __assert_fail("template_global_dict_owner_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x38b,
                "virtual TemplateString ctemplate::TemplateDictionary::GetValue(const TemplateString &) const"
               );
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->variable_dict_) {
      if (const TemplateString* it = find_ptr(*d->variable_dict_, variable.GetGlobalId()))
        return *it;
    }
  }

  // No match in the dict tree. Check the template-global dict.
  assert(template_global_dict_owner_ != NULL);
  if (template_global_dict_owner_->template_global_dict_
      && template_global_dict_owner_->template_global_dict_->variable_dict_) {
    const VariableDict* template_global_vars =
        template_global_dict_owner_->template_global_dict_->variable_dict_;

    if (const TemplateString* it = find_ptr(*template_global_vars, variable.GetGlobalId()))
      return *it;
  }

  // No match in dict tree or template-global dict.  Last chance: global dict.
  {
    ReaderMutexLock ml(&g_static_mutex);
    if (const TemplateString* it = find_ptr(*global_dict_, variable.GetGlobalId()))
      return *it;
    return *empty_string_;
  }
}